

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testMajorAxis<Imath_2_5::Vec2<double>>(char *type)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  double *pdVar7;
  char *in_RDI;
  Box<Imath_2_5::Vec2<double>_> b_2;
  Vec2<double> max;
  uint j_1;
  uint i_1;
  uint j;
  Vec2<double> size;
  uint major;
  Box<Imath_2_5::Vec2<double>_> b_1;
  uint i;
  vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_> perms;
  Box<Imath_2_5::Vec2<double>_> b;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  Box<Imath_2_5::Vec2<double>_> *in_stack_fffffffffffffee0;
  vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_>
  *in_stack_ffffffffffffff10;
  Vec2<double> local_c8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  Vec2<double> local_a8;
  Vec2<double> local_98;
  uint local_84;
  Vec2<double> local_80 [3];
  uint local_50;
  vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_> local_40 [2];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    majorAxis() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec2<double>_>::Box
            ((Box<Imath_2_5::Vec2<double>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  uVar1 = Imath_2_5::Box<Imath_2_5::Vec2<double>_>::majorAxis(in_stack_fffffffffffffee0);
  if (uVar1 != 0) {
    __assert_fail("b.majorAxis() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x394,
                  "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<double>]"
                 );
  }
  std::vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_>::vector
            ((vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_> *)0x1259b3)
  ;
  permutations<Imath_2_5::Vec2<double>>(in_stack_ffffffffffffff10);
  local_50 = 0;
  while( true ) {
    uVar5 = (ulong)local_50;
    sVar6 = std::vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_>::size
                      (local_40);
    if (sVar6 <= uVar5) {
      std::vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_>::~vector
                ((vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_> *)
                 in_stack_fffffffffffffee0);
      local_b0 = 0;
      do {
        uVar1 = local_b0;
        uVar2 = Imath_2_5::Vec2<double>::dimensions();
        if (uVar2 <= uVar1) {
          return;
        }
        local_b4 = 0;
        while( true ) {
          uVar2 = local_b4;
          uVar3 = Imath_2_5::Vec2<double>::dimensions();
          if (uVar3 <= uVar2) break;
          Imath_2_5::Vec2<double>::Vec2(&local_c8,0.0);
          pdVar7 = Imath_2_5::Vec2<double>::operator[](&local_c8,local_b4);
          *pdVar7 = 1.0;
          Imath_2_5::Vec2<double>::Vec2((Vec2<double> *)&stack0xffffffffffffff08,0.0);
          Imath_2_5::Box<Imath_2_5::Vec2<double>_>::Box
                    (in_stack_fffffffffffffee0,
                     (Vec2<double> *)CONCAT44(in_stack_fffffffffffffedc,uVar1),
                     (Vec2<double> *)CONCAT44(uVar2,in_stack_fffffffffffffed0));
          uVar2 = Imath_2_5::Box<Imath_2_5::Vec2<double>_>::majorAxis(in_stack_fffffffffffffee0);
          if (uVar2 != local_b4) {
            __assert_fail("b.majorAxis() == j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                          ,0x3c2,
                          "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<double>]"
                         );
          }
          local_b4 = local_b4 + 1;
        }
        local_b0 = local_b0 + 1;
      } while( true );
    }
    Imath_2_5::Vec2<double>::Vec2(local_80,0.0);
    std::vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_>::operator[]
              (local_40,(ulong)local_50);
    Imath_2_5::Box<Imath_2_5::Vec2<double>_>::Box
              (in_stack_fffffffffffffee0,
               (Vec2<double> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (Vec2<double> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    local_84 = 0;
    std::vector<Imath_2_5::Vec2<double>,_std::allocator<Imath_2_5::Vec2<double>_>_>::operator[]
              (local_40,(ulong)local_50);
    Imath_2_5::Vec2<double>::Vec2(&local_a8,0.0);
    Imath_2_5::Vec2<double>::operator-
              ((Vec2<double> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (Vec2<double> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    local_ac = 1;
    while( true ) {
      uVar1 = local_ac;
      uVar2 = Imath_2_5::Vec2<double>::dimensions();
      if (uVar2 <= uVar1) break;
      pdVar7 = Imath_2_5::Vec2<double>::operator[](&local_98,local_ac);
      in_stack_fffffffffffffee0 = (Box<Imath_2_5::Vec2<double>_> *)*pdVar7;
      pdVar7 = Imath_2_5::Vec2<double>::operator[](&local_98,local_84);
      if (*pdVar7 <= (double)in_stack_fffffffffffffee0 &&
          (double)in_stack_fffffffffffffee0 != *pdVar7) {
        local_84 = local_ac;
      }
      local_ac = local_ac + 1;
    }
    in_stack_fffffffffffffedc =
         Imath_2_5::Box<Imath_2_5::Vec2<double>_>::majorAxis(in_stack_fffffffffffffee0);
    if (in_stack_fffffffffffffedc != local_84) break;
    local_50 = local_50 + 1;
  }
  __assert_fail("b.majorAxis() == major",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                ,0x3a9,
                "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<double>]"
               );
}

Assistant:

void
testMajorAxis(const char *type)
{
    cout << "    majorAxis() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.majorAxis() == 0);
    }

    //
    // Non-empty, has-volume box.
    // Boxes are [ (0, 0, ...), (<all permutations of 1..T::dimensions()>) ]
    //
    {
        std::vector<T> perms;
        permutations(perms);

        for (unsigned int i = 0; i < perms.size(); i++)
        {
            IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), perms[i]);

            unsigned int major = 0;
            T size = perms[i] - T(0);
            for (unsigned int j = 1; j < T::dimensions(); j++)
                if (size[j] > size[major])
                    major = j;
                    
            assert(b.majorAxis() == major);
        }
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0), (1, 0) ]
    //    2D: [(0, 0), (0, 1) ]
    //
    //    3D: [(0, 0), (1, 0, 0) ]
    //    3D: [(0, 0), (0, 1, 0) ]
    //    3D: [(0, 0), (0, 0, 1) ]
    //
    //    and similarly for 4D
    //
    {
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            for (unsigned int j = 0; j < T::dimensions(); j++)
            {
                T max(0);
                max[j] = 1;

                IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), max);
                assert(b.majorAxis() == j);
            }
        }
    }
}